

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void speech_prog_ice_dragon_statue(OBJ_DATA *obj,CHAR_DATA *ch,char *speech)

{
  byte *pbVar1;
  bool bVar2;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  
  bVar2 = str_cmp(speech,"Valnian");
  if (!bVar2) {
    pMobIndex = get_mob_index(0x651);
    ch_00 = create_mobile(pMobIndex);
    if (ch_00 != (CHAR_DATA *)0x0) {
      bVar2 = is_worn(obj);
      if (bVar2) {
        char_to_room(ch_00,ch->in_room);
        if (ch->level < 0x28) {
          do_say(ch_00,"You dare to call upon me, weakling?!");
          multi_hit(ch_00,ch,-1);
        }
        else {
          act("$p shatters violently in a cloud of ice. As it clears, a dragon of pure ice hovers over you."
              ,ch_00,obj,(void *)0x0,0);
          add_follower(ch_00,ch);
          ch_00->leader = ch;
          pbVar1 = (byte *)((long)ch_00->affected_by + 2);
          *pbVar1 = *pbVar1 | 4;
        }
        extract_obj(obj);
        return;
      }
    }
  }
  return;
}

Assistant:

void speech_prog_ice_dragon_statue(OBJ_DATA *obj, CHAR_DATA *ch, char *speech)
{
	CHAR_DATA *dragon;
	if (str_cmp(speech, "Valnian"))
		return;

	dragon = create_mobile(get_mob_index(1617));

	if (!dragon || !is_worn(obj))
		return;

	char_to_room(dragon, ch->in_room);

	if (ch->level < 40)
	{
		do_say(dragon, "You dare to call upon me, weakling?!");
		multi_hit(dragon, ch, TYPE_UNDEFINED);
		extract_obj(obj);

		return;
	}

	act("$p shatters violently in a cloud of ice. As it clears, a dragon of pure ice hovers over you.", dragon, obj, 0, TO_ROOM);
	add_follower(dragon, ch);

	dragon->leader = ch;

	SET_BIT(dragon->affected_by, AFF_CHARM);

	extract_obj(obj);
}